

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::AppendProperty
          (cmTarget *this,string *prop,string *value,optional<cmListFileBacktrace> *bt,bool asString
          )

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  cmMakefile *pcVar2;
  string *psVar3;
  bool bVar4;
  __type _Var5;
  ostream *poVar6;
  ulong uVar7;
  pointer pcVar8;
  pointer pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  string_view local_7c8;
  undefined1 local_7b8 [8];
  cmListFileBacktrace lfbt_11;
  cmListFileBacktrace lfbt_10;
  cmListFileBacktrace lfbt_9;
  cmListFileBacktrace lfbt_8;
  cmListFileBacktrace lfbt_7;
  cmListFileBacktrace lfbt_6;
  ostringstream local_738 [8];
  ostringstream e_3;
  allocator<char> local_5b9;
  string local_5b8;
  cmValue local_598;
  undefined1 local_590 [8];
  cmListFileBacktrace lfbt_5;
  cmListFileBacktrace lfbt_4;
  cmListFileBacktrace lfbt_3;
  cmListFileBacktrace lfbt_2;
  cmListFileBacktrace lfbt_1;
  cmListFileBacktrace lfbt;
  ostringstream local_510 [8];
  ostringstream e_2;
  string local_398;
  ostringstream local_378 [8];
  ostringstream e_1;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream e;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  optional<cmListFileBacktrace> *poStack_28;
  bool asString_local;
  optional<cmListFileBacktrace> *bt_local;
  string *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  local_29 = asString;
  poStack_28 = bt;
  bt_local = (optional<cmListFileBacktrace> *)value;
  value_local = prop;
  prop_local = (string *)this;
  bVar4 = std::operator==(prop,"NAME");
  if (bVar4) {
    pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar2 = pcVar8->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"NAME property is read-only\n",&local_51);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  else {
    bVar4 = std::operator==(value_local,"EXPORT_NAME");
    if ((bVar4) && (bVar4 = IsImported(this), bVar4)) {
      std::__cxx11::ostringstream::ostringstream(local_1e0);
      poVar6 = std::operator<<((ostream *)local_1e0,
                               "EXPORT_NAME property can\'t be set on imported targets (\"");
      pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      poVar6 = std::operator<<(poVar6,(string *)&pcVar8->Name);
      std::operator<<(poVar6,"\")\n");
      pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      pcVar2 = pcVar8->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::ostringstream::~ostringstream(local_1e0);
    }
    else {
      bVar4 = std::operator==(value_local,"SOURCES");
      if ((bVar4) && (bVar4 = IsImported(this), bVar4)) {
        std::__cxx11::ostringstream::ostringstream(local_378);
        poVar6 = std::operator<<((ostream *)local_378,
                                 "SOURCES property can\'t be set on imported targets (\"");
        pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        poVar6 = std::operator<<(poVar6,(string *)&pcVar8->Name);
        std::operator<<(poVar6,"\")\n");
        pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        pcVar2 = pcVar8->Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::ostringstream::~ostringstream(local_378);
      }
      else {
        bVar4 = std::operator==(value_local,"IMPORTED_GLOBAL");
        if (bVar4) {
          std::__cxx11::ostringstream::ostringstream(local_510);
          poVar6 = std::operator<<((ostream *)local_510,
                                   "IMPORTED_GLOBAL property can\'t be appended, only set on imported targets (\""
                                  );
          pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                   operator->(&this->impl);
          poVar6 = std::operator<<(poVar6,(string *)&pcVar8->Name);
          std::operator<<(poVar6,"\")\n");
          pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                   operator->(&this->impl);
          pcVar2 = pcVar8->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage
                    (pcVar2,FATAL_ERROR,
                     (string *)
                     &lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__cxx11::string::~string
                    ((string *)
                     &lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__cxx11::ostringstream::~ostringstream(local_510);
        }
        else {
          bVar4 = std::operator==(value_local,"INCLUDE_DIRECTORIES");
          if (bVar4) {
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                       operator->(&this->impl);
              p_Var1 = &lfbt_1.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount;
              cmTargetInternals::GetBacktrace
                        ((cmTargetInternals *)p_Var1,(optional<cmListFileBacktrace> *)pcVar8);
              pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                       operator->(&this->impl);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)&pcVar8->IncludeDirectoriesEntries,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         bt_local,(cmListFileBacktrace *)p_Var1);
              cmListFileBacktrace::~cmListFileBacktrace
                        ((cmListFileBacktrace *)
                         &lfbt_1.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                          .
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
            }
          }
          else {
            bVar4 = std::operator==(value_local,"COMPILE_OPTIONS");
            if (bVar4) {
              uVar7 = std::__cxx11::string::empty();
              if ((uVar7 & 1) == 0) {
                pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ::operator->(&this->impl);
                p_Var1 = &lfbt_2.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                          .
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount;
                cmTargetInternals::GetBacktrace
                          ((cmTargetInternals *)p_Var1,(optional<cmListFileBacktrace> *)pcVar8);
                pcVar8 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ::operator->(&this->impl);
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            *)&pcVar8->CompileOptionsEntries,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           bt_local,(cmListFileBacktrace *)p_Var1);
                cmListFileBacktrace::~cmListFileBacktrace
                          ((cmListFileBacktrace *)
                           &lfbt_2.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                            TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
            }
            else {
              bVar4 = std::operator==(value_local,"COMPILE_FEATURES");
              if (bVar4) {
                uVar7 = std::__cxx11::string::empty();
                if ((uVar7 & 1) == 0) {
                  pcVar8 = std::
                           unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                           operator->(&this->impl);
                  p_Var1 = &lfbt_3.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                            TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount;
                  cmTargetInternals::GetBacktrace
                            ((cmTargetInternals *)p_Var1,(optional<cmListFileBacktrace> *)pcVar8);
                  pcVar8 = std::
                           unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                           operator->(&this->impl);
                  std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                  emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                            ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              *)&pcVar8->CompileFeaturesEntries,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             bt_local,(cmListFileBacktrace *)p_Var1);
                  cmListFileBacktrace::~cmListFileBacktrace
                            ((cmListFileBacktrace *)
                             &lfbt_3.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                              TopEntry.
                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
              }
              else {
                bVar4 = std::operator==(value_local,"COMPILE_DEFINITIONS");
                if (bVar4) {
                  uVar7 = std::__cxx11::string::empty();
                  if ((uVar7 & 1) == 0) {
                    pcVar8 = std::
                             unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ::operator->(&this->impl);
                    p_Var1 = &lfbt_4.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                              TopEntry.
                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount;
                    cmTargetInternals::GetBacktrace
                              ((cmTargetInternals *)p_Var1,(optional<cmListFileBacktrace> *)pcVar8);
                    pcVar8 = std::
                             unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ::operator->(&this->impl);
                    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                    emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                *)&pcVar8->CompileDefinitionsEntries,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               bt_local,(cmListFileBacktrace *)p_Var1);
                    cmListFileBacktrace::~cmListFileBacktrace
                              ((cmListFileBacktrace *)
                               &lfbt_4.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                TopEntry.
                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                  }
                }
                else {
                  bVar4 = std::operator==(value_local,"LINK_OPTIONS");
                  if (bVar4) {
                    uVar7 = std::__cxx11::string::empty();
                    if ((uVar7 & 1) == 0) {
                      pcVar8 = std::
                               unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ::operator->(&this->impl);
                      p_Var1 = &lfbt_5.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                TopEntry.
                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount;
                      cmTargetInternals::GetBacktrace
                                ((cmTargetInternals *)p_Var1,(optional<cmListFileBacktrace> *)pcVar8
                                );
                      pcVar8 = std::
                               unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ::operator->(&this->impl);
                      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                      ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  *)&pcVar8->LinkOptionsEntries,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)bt_local,(cmListFileBacktrace *)p_Var1);
                      cmListFileBacktrace::~cmListFileBacktrace
                                ((cmListFileBacktrace *)
                                 &lfbt_5.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                  TopEntry.
                                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                  }
                  else {
                    bVar4 = std::operator==(value_local,"LINK_DIRECTORIES");
                    if (bVar4) {
                      uVar7 = std::__cxx11::string::empty();
                      if ((uVar7 & 1) == 0) {
                        pcVar8 = std::
                                 unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ::operator->(&this->impl);
                        cmTargetInternals::GetBacktrace
                                  ((cmTargetInternals *)local_590,
                                   (optional<cmListFileBacktrace> *)pcVar8);
                        pcVar8 = std::
                                 unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ::operator->(&this->impl);
                        std::
                        vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                    *)&pcVar8->LinkDirectoriesEntries,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)bt_local,(cmListFileBacktrace *)local_590);
                        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_590);
                      }
                    }
                    else {
                      bVar4 = std::operator==(value_local,"PRECOMPILE_HEADERS");
                      if (bVar4) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_5b8,"PRECOMPILE_HEADERS_REUSE_FROM",&local_5b9);
                        local_598 = GetProperty(this,&local_5b8);
                        bVar4 = cmValue::operator_cast_to_bool(&local_598);
                        std::__cxx11::string::~string((string *)&local_5b8);
                        std::allocator<char>::~allocator(&local_5b9);
                        if (bVar4) {
                          std::__cxx11::ostringstream::ostringstream(local_738);
                          poVar6 = std::operator<<((ostream *)local_738,
                                                                                                      
                                                  "PRECOMPILE_HEADERS_REUSE_FROM property is already set on target (\""
                                                  );
                          pcVar8 = std::
                                   unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ::operator->(&this->impl);
                          poVar6 = std::operator<<(poVar6,(string *)&pcVar8->Name);
                          std::operator<<(poVar6,"\")\n");
                          pcVar8 = std::
                                   unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ::operator->(&this->impl);
                          pcVar2 = pcVar8->Makefile;
                          std::__cxx11::ostringstream::str();
                          cmMakefile::IssueMessage
                                    (pcVar2,FATAL_ERROR,
                                     (string *)
                                     &lfbt_6.
                                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                      TopEntry.
                                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                          std::__cxx11::string::~string
                                    ((string *)
                                     &lfbt_6.
                                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                      TopEntry.
                                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                          std::__cxx11::ostringstream::~ostringstream(local_738);
                        }
                        else {
                          uVar7 = std::__cxx11::string::empty();
                          if ((uVar7 & 1) == 0) {
                            pcVar8 = std::
                                     unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ::operator->(&this->impl);
                            p_Var1 = &lfbt_7.
                                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                      TopEntry.
                                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount;
                            cmTargetInternals::GetBacktrace
                                      ((cmTargetInternals *)p_Var1,
                                       (optional<cmListFileBacktrace> *)pcVar8);
                            pcVar8 = std::
                                     unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ::operator->(&this->impl);
                            std::
                            vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                        *)&pcVar8->PrecompileHeadersEntries,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)bt_local,(cmListFileBacktrace *)p_Var1);
                            cmListFileBacktrace::~cmListFileBacktrace
                                      ((cmListFileBacktrace *)
                                       &lfbt_7.
                                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                        TopEntry.
                                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                          }
                        }
                      }
                      else {
                        bVar4 = std::operator==(value_local,"LINK_LIBRARIES");
                        if (bVar4) {
                          uVar7 = std::__cxx11::string::empty();
                          if ((uVar7 & 1) == 0) {
                            pcVar8 = std::
                                     unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ::operator->(&this->impl);
                            p_Var1 = &lfbt_8.
                                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                      TopEntry.
                                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount;
                            cmTargetInternals::GetBacktrace
                                      ((cmTargetInternals *)p_Var1,
                                       (optional<cmListFileBacktrace> *)pcVar8);
                            pcVar8 = std::
                                     unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ::operator->(&this->impl);
                            std::
                            vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                        *)&pcVar8->LinkImplementationPropertyEntries,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)bt_local,(cmListFileBacktrace *)p_Var1);
                            cmListFileBacktrace::~cmListFileBacktrace
                                      ((cmListFileBacktrace *)
                                       &lfbt_8.
                                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                        TopEntry.
                                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                          }
                        }
                        else {
                          _Var5 = std::operator==(value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
                          if (_Var5) {
                            uVar7 = std::__cxx11::string::empty();
                            if ((uVar7 & 1) == 0) {
                              pcVar8 = std::
                                       unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ::operator->(&this->impl);
                              p_Var1 = &lfbt_9.
                                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                        TopEntry.
                                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount;
                              cmTargetInternals::GetBacktrace
                                        ((cmTargetInternals *)p_Var1,
                                         (optional<cmListFileBacktrace> *)pcVar8);
                              pcVar8 = std::
                                       unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ::operator->(&this->impl);
                              std::
                              vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                          *)&pcVar8->LinkInterfacePropertyEntries,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)bt_local,(cmListFileBacktrace *)p_Var1);
                              cmListFileBacktrace::~cmListFileBacktrace
                                        ((cmListFileBacktrace *)
                                         &lfbt_9.
                                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                          .TopEntry.
                                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                            }
                          }
                          else {
                            _Var5 = std::operator==(value_local,
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
                            if (_Var5) {
                              uVar7 = std::__cxx11::string::empty();
                              if ((uVar7 & 1) == 0) {
                                pcVar8 = std::
                                         unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ::operator->(&this->impl);
                                p_Var1 = &lfbt_10.
                                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                          .TopEntry.
                                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount;
                                cmTargetInternals::GetBacktrace
                                          ((cmTargetInternals *)p_Var1,
                                           (optional<cmListFileBacktrace> *)pcVar8);
                                pcVar8 = std::
                                         unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ::operator->(&this->impl);
                                std::
                                vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                            *)&pcVar8->LinkInterfaceDirectPropertyEntries,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)bt_local,(cmListFileBacktrace *)p_Var1);
                                cmListFileBacktrace::~cmListFileBacktrace
                                          ((cmListFileBacktrace *)
                                           &lfbt_10.
                                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                            .TopEntry.
                                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                              }
                            }
                            else {
                              _Var5 = std::operator==(value_local,
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                                                                        
                                                  propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_
                                                  );
                              if (_Var5) {
                                uVar7 = std::__cxx11::string::empty();
                                if ((uVar7 & 1) == 0) {
                                  pcVar8 = std::
                                           unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                           ::operator->(&this->impl);
                                  p_Var1 = &lfbt_11.
                                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                            .TopEntry.
                                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount;
                                  cmTargetInternals::GetBacktrace
                                            ((cmTargetInternals *)p_Var1,
                                             (optional<cmListFileBacktrace> *)pcVar8);
                                  pcVar8 = std::
                                           unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                           ::operator->(&this->impl);
                                  std::
                                  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                            ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                              *)&pcVar8->LinkInterfaceDirectExcludePropertyEntries,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)bt_local,(cmListFileBacktrace *)p_Var1);
                                  cmListFileBacktrace::~cmListFileBacktrace
                                            ((cmListFileBacktrace *)
                                             &lfbt_11.
                                              super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                              .TopEntry.
                                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
                                }
                              }
                              else {
                                bVar4 = std::operator==(value_local,"SOURCES");
                                if (bVar4) {
                                  pcVar8 = std::
                                           unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                           ::operator->(&this->impl);
                                  cmTargetInternals::GetBacktrace
                                            ((cmTargetInternals *)local_7b8,
                                             (optional<cmListFileBacktrace> *)pcVar8);
                                  pcVar8 = std::
                                           unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                           ::operator->(&this->impl);
                                  std::
                                  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                            ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                              *)&pcVar8->SourceEntries,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)bt_local,(cmListFileBacktrace *)local_7b8);
                                  cmListFileBacktrace::~cmListFileBacktrace
                                            ((cmListFileBacktrace *)local_7b8);
                                }
                                else {
                                  local_7c8 = (string_view)
                                              std::__cxx11::string::
                                              operator_cast_to_basic_string_view
                                                        ((string *)value_local);
                                  bVar4 = cmHasLiteralPrefix<17ul>
                                                    (local_7c8,(char (*) [17])"IMPORTED_LIBNAME");
                                  if (bVar4) {
                                    pcVar8 = std::
                                             unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                             ::operator->(&this->impl);
                                    pcVar2 = pcVar8->Makefile;
                                    std::operator+(&local_7e8,value_local,
                                                   " property may not be APPENDed.");
                                    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_7e8);
                                    std::__cxx11::string::~string((string *)&local_7e8);
                                  }
                                  else {
                                    bVar4 = std::operator==(value_local,"C_STANDARD");
                                    if (!bVar4) {
                                      bVar4 = std::operator==(value_local,"CXX_STANDARD");
                                      if (!bVar4) {
                                        bVar4 = std::operator==(value_local,"CUDA_STANDARD");
                                        if (!bVar4) {
                                          bVar4 = std::operator==(value_local,"HIP_STANDARD");
                                          if (!bVar4) {
                                            bVar4 = std::operator==(value_local,"OBJC_STANDARD");
                                            if (!bVar4) {
                                              bVar4 = std::operator==(value_local,"OBJCXX_STANDARD")
                                              ;
                                              if (!bVar4) {
                                                pcVar8 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                pcVar9 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::get(&this->impl);
                                                psVar3 = value_local;
                                                std::__cxx11::string::string
                                                          ((string *)&local_828,(string *)bt_local);
                                                bVar4 = (anonymous_namespace)::FileSetType::
                                                        WriteProperties<std::__cxx11::string>
                                                                  ((FileSetType *)
                                                                   &pcVar8->HeadersFileSets,this,
                                                                   pcVar9,psVar3,&local_828,false);
                                                std::__cxx11::string::~string((string *)&local_828);
                                                if (bVar4) {
                                                  return;
                                                }
                                                pcVar8 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                pcVar9 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::get(&this->impl);
                                                psVar3 = value_local;
                                                std::__cxx11::string::string
                                                          ((string *)&local_848,(string *)bt_local);
                                                bVar4 = (anonymous_namespace)::FileSetType::
                                                        WriteProperties<std::__cxx11::string>
                                                                  ((FileSetType *)
                                                                   &pcVar8->CxxModulesFileSets,this,
                                                                   pcVar9,psVar3,&local_848,false);
                                                std::__cxx11::string::~string((string *)&local_848);
                                                if (bVar4) {
                                                  return;
                                                }
                                                pcVar8 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                pcVar9 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::get(&this->impl);
                                                psVar3 = value_local;
                                                std::__cxx11::string::string
                                                          ((string *)&local_868,(string *)bt_local);
                                                bVar4 = (anonymous_namespace)::FileSetType::
                                                        WriteProperties<std::__cxx11::string>
                                                                  ((FileSetType *)
                                                                   &pcVar8->CxxModuleHeadersFileSets
                                                                   ,this,pcVar9,psVar3,&local_868,
                                                                   false);
                                                std::__cxx11::string::~string((string *)&local_868);
                                                if (bVar4) {
                                                  return;
                                                }
                                                pcVar8 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                cmPropertyMap::AppendProperty
                                                          (&pcVar8->Properties,value_local,
                                                           (string *)bt_local,(bool)(local_29 & 1));
                                                return;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                    pcVar8 = std::
                                             unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                             ::operator->(&this->impl);
                                    pcVar2 = pcVar8->Makefile;
                                    std::operator+(&local_808,value_local,
                                                   " property may not be appended.");
                                    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_808);
                                    std::__cxx11::string::~string((string *)&local_808);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop,
                              const std::string& value,
                              cm::optional<cmListFileBacktrace> const& bt,
                              bool asString)
{
  if (prop == "NAME") {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "NAME property is read-only\n");
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "IMPORTED_GLOBAL") {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be appended, only set on imported "
         "targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->IncludeDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->CompileOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->CompileFeaturesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->CompileDefinitionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "LINK_OPTIONS") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "LINK_DIRECTORIES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "PRECOMPILE_HEADERS") {
    if (this->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM")) {
      std::ostringstream e;
      e << "PRECOMPILE_HEADERS_REUSE_FROM property is already set on target "
           "(\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->PrecompileHeadersEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkImplementationPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkInterfacePropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkInterfaceDirectPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkInterfaceDirectExcludePropertyEntries.emplace_back(value,
                                                                         lfbt);
    }
  } else if (prop == "SOURCES") {
    cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
    this->impl->SourceEntries.emplace_back(value, lfbt);
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME")) {
    this->impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR, prop + " property may not be APPENDed.");
  } else if (prop == "C_STANDARD" || prop == "CXX_STANDARD" ||
             prop == "CUDA_STANDARD" || prop == "HIP_STANDARD" ||
             prop == "OBJC_STANDARD" || prop == "OBJCXX_STANDARD") {
    this->impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR, prop + " property may not be appended.");
  } else if (this->impl->HeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value,
               false)) { // NOLINT(bugprone-branch-clone)
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModulesFileSets.WriteProperties(
               this, this->impl.get(), prop, value, false)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModuleHeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, false)) {
    /* Handled in the `if` condition. */
  } else {
    this->impl->Properties.AppendProperty(prop, value, asString);
  }
}